

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

PortType BasePort::DefaultPortType(void)

{
  return PORT_FIREWIRE;
}

Assistant:

BasePort::PortType BasePort::DefaultPortType(void)
{
#if Amp1394_HAS_RAW1394
    return PORT_FIREWIRE;
#elif Amp1394_HAS_EMIO
    return PORT_ZYNQ_EMIO;
#else
    return PORT_ETH_UDP;
#endif

}